

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osd_0.c
# Opt level: O1

int osd_0_solve(mod2sparse *A,mod2sparse *L,mod2sparse *U,int *cols,int *rows,char *synd,
               char *osd0_decoding,double *log_prob_ratios,int A_rank,int post_processing)

{
  uint n;
  int iVar1;
  int extraout_EAX;
  void *__ptr;
  long lVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  n = A->n_cols;
  lVar5 = (long)(int)n;
  soft_decision_col_sort(log_prob_ratios,cols,n);
  __ptr = chk_alloc(n,4);
  if (0 < lVar5) {
    lVar2 = 0;
    do {
      *(int *)((long)__ptr + lVar2 * 4) = cols[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar5 != lVar2);
  }
  mod2sparse_decomp_osd(A,A_rank,L,U,rows,cols);
  if (0 < (int)n && post_processing == 1) {
    lVar2 = 0;
    iVar3 = 0;
    do {
      iVar1 = *(int *)((long)__ptr + lVar2 * 4);
      if (0 < A_rank) {
        uVar4 = 0;
        do {
          if (cols[uVar4] == iVar1) goto LAB_0012032f;
          uVar4 = uVar4 + 1;
        } while ((uint)A_rank != uVar4);
      }
      cols[iVar3 + A_rank] = iVar1;
      iVar3 = iVar3 + 1;
LAB_0012032f:
      lVar2 = lVar2 + 1;
    } while (lVar2 != lVar5);
  }
  LU_forward_backward_solve(L,U,rows,cols,synd,osd0_decoding);
  free(__ptr);
  return extraout_EAX;
}

Assistant:

int osd_0_solve(
          mod2sparse *A, //parity check matrix
          mod2sparse *L,
          mod2sparse *U,
          int *cols,
          int *rows,
          char *synd,
          char *osd0_decoding,
          double *log_prob_ratios,
          int A_rank,
          int post_processing) {

      int M = mod2sparse_rows(A);
      int N = mod2sparse_cols(A);
      int k = N - A_rank;

      //sort columns on the basis of soft decisions
      soft_decision_col_sort(log_prob_ratios, cols, N);

      //save the original sorted column list
      int *orig_cols = chk_alloc(N, sizeof(*rows));
      for (int i = 0; i < N; i++) {
          orig_cols[i] = cols[i];
      }

      //Performs LU decomposition of the parity check matrix.
      mod2sparse_decomp_osd
              (A,    /* Input matrix, M by N */
               A_rank,        /* Size of sub-matrix to find LU decomposition of */
               L,    /* Matrix in which L is stored, M by A_rank */
               U,    /* Matrix in which U is stored, A_rank by N */
               rows,        /* Array where row indexes are stored, M long */
               cols        /* Array where column indexes are stored, N long */
              );

      //this next step is necessary to ensure the bits outside of the info set are ordered according to the soft decisions. The decomp function scrambles them!
      if(post_processing==1) {
          //sort the bits outside the info set
          int check;
          int counter = 0;
          int in_pivot;
          for (int i = 0; i < N; i++) {
              check = orig_cols[i];
              in_pivot = 0;
              for (int i = 0; i < A_rank; i++) {
                  if (cols[i] == check) {
                      in_pivot = 1;
                      break;
                  }
              }

              if (in_pivot == 0) {
                  cols[counter + A_rank] = check;
                  counter = counter + 1;
              }

          }

      }

      //solve the syndrome equation using forwards/backwards substitution. This function also reverts the bit string to its original ordering.
      LU_forward_backward_solve(
              L,
              U,
              rows,
              cols,
              synd,
              osd0_decoding);


      //cleanup
      free(orig_cols);

  }